

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  CaseValues *pCVar1;
  _Alloc_hider __rhs;
  deBool dVar2;
  ostream *poVar3;
  char *pcVar4;
  runtime_error *this;
  int iVar5;
  pointer pbVar6;
  int resultNdx;
  long lVar7;
  NumericValue *value;
  allocator<char> local_9b9;
  CommandLine cmdLine;
  BatchResultValues local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  ifstream in;
  uint local_8e0;
  int aiStack_8c8 [122];
  TagParser resultHandler;
  TestLogParser parser;
  deUint8 buf [1024];
  
  cmdLine.filename._M_dataplus._M_p = (pointer)&cmdLine.filename.field_2;
  cmdLine.filename._M_string_length = 0;
  cmdLine.filename.field_2._M_local_buf[0] = '\0';
  cmdLine.tagNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLine.tagNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  cmdLine.tagNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  cmdLine.tagNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  cmdLine._49_8_ = 0;
  for (lVar7 = 1; lVar7 < argc; lVar7 = lVar7 + 1) {
    pcVar4 = argv[lVar7];
    dVar2 = deStringEqual(pcVar4,"--statuscode");
    if (dVar2 == 0) {
      dVar2 = deStringBeginsWith(pcVar4,"--");
      if (dVar2 != 0) goto LAB_0010d6cb;
      if (cmdLine.filename._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&cmdLine);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)buf,pcVar4,(allocator<char> *)&in);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &cmdLine.tagNames,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf);
        std::__cxx11::string::~string((string *)buf);
      }
    }
    else {
      cmdLine.statusCode = true;
    }
  }
  if (cmdLine.filename._M_string_length == 0) {
LAB_0010d6cb:
    printf("%s: [filename] [name 1] [[name 2]...]\n",*argv);
    puts(" --statuscode     Include status code as first entry.");
    iVar5 = -1;
  }
  else {
    BatchResultValues::BatchResultValues(&local_978,&cmdLine.tagNames);
    __rhs = cmdLine.filename._M_dataplus;
    std::ifstream::ifstream(&in,cmdLine.filename._M_dataplus._M_p,_S_in|_S_bin);
    TagParser::TagParser(&resultHandler,&local_978);
    xe::TestLogParser::TestLogParser(&parser,&resultHandler.super_TestLogHandler);
    if (*(int *)((long)aiStack_8c8 + *(long *)(_in + -0x18)) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_948,"Failed to open \'",&local_9b9);
      std::operator+(&local_928,&local_948,__rhs._M_p);
      std::operator+(&local_908,&local_928,"\'");
      std::runtime_error::runtime_error(this,(string *)&local_908);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while (std::istream::read((char *)&in,(long)buf), 0 < (int)local_8e0) {
      xe::TestLogParser::parse(&parser,buf,(ulong)(local_8e0 & 0x7fffffff));
    }
    std::ifstream::close();
    xe::TestLogParser::~TestLogParser(&parser);
    TagParser::~TagParser(&resultHandler);
    std::ifstream::~ifstream(&in);
    std::operator<<((ostream *)&std::cout,"CasePath");
    pbVar6 = local_978.m_tagNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (cmdLine.statusCode == true) {
      std::operator<<((ostream *)&std::cout,",StatusCode");
      pbVar6 = local_978.m_tagNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pbVar6 != local_978.m_tagNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,",");
      std::operator<<(poVar3,(string *)pbVar6);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    for (lVar7 = 0;
        lVar7 < (int)((ulong)((long)local_978.m_caseValues.
                                    super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_978.m_caseValues.
                                   super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar7 = lVar7 + 1) {
      pCVar1 = local_978.m_caseValues.
               super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      std::operator<<((ostream *)&std::cout,(string *)pCVar1);
      if (cmdLine.statusCode == true) {
        poVar3 = std::operator<<((ostream *)&std::cout,",");
        pcVar4 = xe::getTestStatusCodeName(pCVar1->statusCode);
        std::operator<<(poVar3,pcVar4);
      }
      for (value = (pCVar1->values).
                   super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          value != (pCVar1->values).
                   super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
                   _M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,",");
        xe::ri::operator<<(poVar3,value);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    BatchResultValues::~BatchResultValues(&local_978);
    iVar5 = 0;
  }
  CommandLine::~CommandLine(&cmdLine);
  return iVar5;
}

Assistant:

int main (int argc, const char* const* argv)
{
	try
	{
		CommandLine cmdLine;

		if (!parseCommandLine(cmdLine, argc, argv))
		{
			printHelp(argv[0]);
			return -1;
		}

		printTaggedValues(cmdLine, std::cout);
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}